

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint zlib_compress(uchar **out,size_t *outsize,uchar *in,size_t insize,
                  LodePNGCompressSettings *settings)

{
  uint uVar1;
  uint error;
  LodePNGCompressSettings *settings_local;
  size_t insize_local;
  uchar *in_local;
  size_t *outsize_local;
  uchar **out_local;
  
  if (settings->custom_zlib ==
      (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGCompressSettings_ptr *)0x0) {
    out_local._4_4_ = lodepng_zlib_compress(out,outsize,in,insize,settings);
  }
  else {
    uVar1 = (*settings->custom_zlib)(out,outsize,in,insize,settings);
    out_local._4_4_ = 0;
    if (uVar1 != 0) {
      out_local._4_4_ = 0x6f;
    }
  }
  return out_local._4_4_;
}

Assistant:

static unsigned zlib_compress(unsigned char** out, size_t* outsize, const unsigned char* in,
                              size_t insize, const LodePNGCompressSettings* settings) {
  if(settings->custom_zlib) {
    unsigned error = settings->custom_zlib(out, outsize, in, insize, settings);
    /*the custom zlib is allowed to have its own error codes, however, we translate it to code 111*/
    return error ? 111 : 0;
  } else {
    return lodepng_zlib_compress(out, outsize, in, insize, settings);
  }
}